

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Scanner::scan(Scanner *this,string *filename)

{
  char c;
  int iVar1;
  bool bVar2;
  byte bVar3;
  int state_before;
  ostream *poVar4;
  size_type sVar5;
  int state;
  int local_fdc;
  string buffer;
  string text;
  string local_f98;
  string local_f78;
  ifstream in;
  byte abStack_f38 [200];
  undefined8 auStack_e70 [36];
  Automatic at;
  
  state = 1;
  std::__cxx11::string::string((string *)&buffer,"",(allocator *)&at);
  Automatic::Automatic(&at);
  std::ifstream::ifstream(&in,(string *)filename,_S_in);
  if ((abStack_f38[*(long *)(_in + -0x18)] & 5) == 0) {
    text._M_dataplus._M_p = (pointer)&text.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&text,*(undefined8 *)((long)auStack_e70 + *(long *)(_in + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    std::__cxx11::string::append((char *)&text);
    std::ifstream::close();
    bVar3 = 0;
    while( true ) {
      while( true ) {
        state_before = state;
        iVar1 = this->curIndex;
        sVar5 = (size_type)iVar1;
        if (text._M_string_length == sVar5) {
          std::__cxx11::string::~string((string *)&text);
          std::ifstream::~ifstream(&in);
          Automatic::~Automatic(&at);
          std::__cxx11::string::~string((string *)&buffer);
          return;
        }
        this->curIndex = (int)(sVar5 + 1);
        c = text._M_dataplus._M_p[sVar5];
        if (!(bool)(c != '*' & bVar3)) break;
        if (c == '\n') {
          this->curLine = this->curLine + 1;
        }
      }
      bVar2 = (bool)(c == '*' & bVar3);
      if (bVar2) break;
      if (((c == '\t') || (c == ' ')) || (c == '\r')) {
LAB_00111d5a:
        std::__cxx11::string::string((string *)&local_f78,(string *)&buffer);
        tokenGenerate(this,state_before,&local_f78);
        std::__cxx11::string::~string((string *)&local_f78);
        std::__cxx11::string::assign((char *)&buffer);
        state = 1;
      }
      else {
        if (c == '\n') {
          this->curLine = this->curLine + 1;
          goto LAB_00111d5a;
        }
        state = Automatic::getState(&at,state,c);
        if ((state_before != 1) || (state != 1)) {
          if (state == 0) {
            if (state_before == 0x2b) {
              reset(this,&state,&local_fdc,&buffer);
LAB_00111e3a:
              bVar3 = bVar2 ^ 1;
            }
            else {
              std::__cxx11::string::string((string *)&local_f98,(string *)&buffer);
              tokenGenerate(this,state_before,&local_f98);
              std::__cxx11::string::~string((string *)&local_f98);
              reset(this,&state,&local_fdc,&buffer);
            }
          }
          else {
            std::__cxx11::string::push_back((char)&buffer);
          }
        }
      }
    }
    this->curIndex = iVar1 + 2;
    if (text._M_dataplus._M_p[sVar5 + 1] == '/') goto LAB_00111e3a;
    poVar4 = std::operator<<((ostream *)&std::cout,"comment is error");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"open Error");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  exit(0);
}

Assistant:

void Scanner::scan(string filename) {
    bool comment = false; //是否有注释
    int state = 1;   //当前状态
    int stateBefore = 1; //前一个状态
    char curChar; //当前字符
    int pos = 0;  //当前位置
    string buffer = ""; //识别到的串
    Automatic at; //初始化自动机
    //int comment_cnt = 0;
    //暂时取消
    ifstream in(filename, ios::in);
    if (!in) {
        cout << "open Error" << endl;
        exit(0);
    }

    //读取文件内容
    istreambuf_iterator<char> begin(in), end;
    string text(begin, end);
    text += "\n";
    in.close();

    //cout << text << endl;

    while (curIndex != text.size()) {
        curChar = text[curIndex++];
        if (comment && curChar != '*') {
            if(curChar == '\n') curLine++;
            continue;
        } else if (curChar == '*' && comment) {
            curChar = text[curIndex++];
            if (curChar == '/') {
                comment = false;
                continue;
            } else {
                cout << "comment is error" << endl;
                exit(0);
            }
        }
        //跳过空格 换行符 \t 以及回车
        if (curChar == '\n' || curChar == '\t' || curChar == ' ' || curChar == '\r') {
            if (curChar == '\n') curLine++;
            tokenGenerate(state, buffer);
            buffer = "";
            state = 1;
            continue;
        }

        stateBefore = state;
        state = at.getState(state, curChar);
        //自动机扫描
        if (state == 1 && stateBefore == 1) {}
        else if (state) {
            buffer += curChar;
        } else {
            //判断是否为注释
            if (stateBefore == 43) {
                comment = true;
                //cout << buffer << endl;
                reset(state, pos, buffer);
                continue;
            }


            tokenGenerate(stateBefore, buffer);
            reset(state, pos, buffer);
        }
    }
}